

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

void __thiscall
Fad<float>::Fad<FadBinaryAdd<Fad<float>,Fad<float>>>
          (Fad<float> *this,FadExpr<FadBinaryAdd<Fad<float>,_Fad<float>_>_> *fadexpr)

{
  int iVar1;
  float *pfVar2;
  Vector<float> *in_RSI;
  FadSuper *in_RDI;
  value_type vVar3;
  int i;
  int sz;
  int in_stack_ffffffffffffffac;
  value_type in_stack_ffffffffffffffb0;
  int iVar4;
  int local_24;
  int in_stack_ffffffffffffffec;
  
  FadSuper::FadSuper(in_RDI);
  vVar3 = FadExpr<FadBinaryAdd<Fad<float>,_Fad<float>_>_>::val
                    ((FadExpr<FadBinaryAdd<Fad<float>,_Fad<float>_>_> *)0x131b94f);
  *(value_type *)in_RDI = vVar3;
  FadExpr<FadBinaryAdd<Fad<float>,_Fad<float>_>_>::size
            ((FadExpr<FadBinaryAdd<Fad<float>,_Fad<float>_>_> *)0x131b97e);
  Vector<float>::Vector(in_RSI,in_stack_ffffffffffffffec);
  *(undefined4 *)(in_RDI + 0x18) = 0;
  iVar1 = FadExpr<FadBinaryAdd<Fad<float>,_Fad<float>_>_>::size
                    ((FadExpr<FadBinaryAdd<Fad<float>,_Fad<float>_>_> *)0x131b9aa);
  if (iVar1 != 0) {
    iVar4 = iVar1;
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      in_stack_ffffffffffffffb0 =
           FadExpr<FadBinaryAdd<Fad<float>,_Fad<float>_>_>::dx
                     ((FadExpr<FadBinaryAdd<Fad<float>,_Fad<float>_>_> *)
                      CONCAT44(iVar4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac);
      pfVar2 = Vector<float>::operator[]((Vector<float> *)(in_RDI + 8),local_24);
      *pfVar2 = in_stack_ffffffffffffffb0;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }